

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int refine(saucy *s,coloring *c)

{
  int iVar1;
  int front;
  coloring *c_local;
  saucy *s_local;
  
  do {
    while( true ) {
      iVar1 = at_terminal(s);
      if (iVar1 != 0) {
        clear_refine(s);
        return 1;
      }
      if (s->nsinduce == 0) break;
      iVar1 = s->nsinduce + -1;
      s->nsinduce = iVar1;
      iVar1 = s->sinduce[iVar1];
      s->indmark[iVar1] = '\0';
      iVar1 = (*s->ref_singleton)(s,c,iVar1);
      if (iVar1 == 0) goto LAB_0037653d;
    }
    if (s->nninduce == 0) {
      return 1;
    }
    iVar1 = s->nninduce + -1;
    s->nninduce = iVar1;
    iVar1 = s->ninduce[iVar1];
    s->indmark[iVar1] = '\0';
    iVar1 = (*s->ref_nonsingle)(s,c,iVar1);
  } while (iVar1 != 0);
LAB_0037653d:
  clear_refine(s);
  return 0;
}

Assistant:

static int
refine(struct saucy *s, struct coloring *c)
{
    int front;

    /* Keep going until refinement stops */
    while (1) {

        /* If discrete, bail */
        if (at_terminal(s)) {
            clear_refine(s);
            return 1;
        };

        /* Look for something else to refine on */
        if (s->nsinduce) {
            front = s->sinduce[--s->nsinduce];
            s->indmark[front] = 0;
            if (!s->ref_singleton(s, c, front)) break;
        }
        else if (s->nninduce) {
            front = s->ninduce[--s->nninduce];
            s->indmark[front] = 0;
            if (!s->ref_nonsingle(s, c, front)) break;
        }
        else {
            return 1;
        };
    }

    clear_refine(s);
    return 0;
}